

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accounts.cpp
# Opt level: O3

void __thiscall Accounts::AddCharacter(Accounts *this,string *username,string *character_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Account account;
  string local_d0;
  Account local_b0;
  Account local_68;
  
  GetAccount(&local_68,this,username);
  pcVar2 = (character_name->_M_dataplus)._M_p;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar2,pcVar2 + character_name->_M_string_length);
  Account::AddCharacter(&local_68,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  paVar1 = &local_b0._username.field_2;
  local_b0._username._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_68._username._M_dataplus._M_p,
             local_68._username._M_dataplus._M_p + local_68._username._M_string_length);
  local_b0._account_level = local_68._account_level;
  local_b0._36_4_ = local_68._36_4_;
  local_b0._password = local_68._password;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_b0.m_characters,&local_68.m_characters);
  AddAccount(this,&local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.m_characters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._username._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._username._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68.m_characters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._username._M_dataplus._M_p != &local_68._username.field_2) {
    operator_delete(local_68._username._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Accounts::AddCharacter(std::string username, std::string character_name) {
    Account account = GetAccount(username);
    account.AddCharacter(character_name);
    AddAccount(account);
}